

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O2

HANDLE OpenMutexA(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCSTR lpName)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    CorUnix::InternalGetCurrentThread();
    if (lpName == (LPCSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00335efc;
      iVar1 = 0x57;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","OpenMutexA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
              ,0x1b9);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      iVar1 = 0x32;
    }
    bVar2 = PAL_InitializeChakraCoreCalled;
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    if ((bVar2 & 1U) != 0) {
      return (HANDLE)0x0;
    }
  }
LAB_00335efc:
  abort();
}

Assistant:

HANDLE
PALAPI
OpenMutexA (
       IN DWORD dwDesiredAccess,
       IN BOOL bInheritHandle,
       IN LPCSTR lpName)
{
    HANDLE hMutex = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(OpenMutexA);
    ENTRY("OpenMutexA(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%s))\n",
          dwDesiredAccess, bInheritHandle, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }

    LOGEXIT("OpenMutexA returns HANDLE %p\n", hMutex);
    PERF_EXIT(OpenMutexA);
    return hMutex;
}